

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlogging.cpp
# Opt level: O0

void qt_message(QtMsgType msgType,QMessageLogContext *context,char *msg,__va_list_tag *ap)

{
  long lVar1;
  __gnuc_va_list in_RCX;
  char *in_RDX;
  QString *in_RSI;
  undefined4 in_EDI;
  long in_FS_OFFSET;
  QString buf;
  QMessageLogContext *in_stack_ffffffffffffff98;
  char **__ptr;
  undefined4 in_stack_ffffffffffffffd0;
  QtMsgType msgType_01;
  QtMsgType msgType_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  msgType_01 = 0xaaaaaaaa;
  __ptr = (char **)&stack0xffffffffffffffd8;
  QString::vasprintf(__ptr,in_RDX,in_RCX);
  msgType_00 = (QtMsgType)((ulong)__ptr >> 0x20);
  qt_message_print(msgType_01,(QMessageLogContext *)CONCAT44(in_EDI,in_stack_ffffffffffffffd0),
                   in_RSI);
  qt_maybe_message_fatal<QString&>(msgType_00,in_stack_ffffffffffffff98,(QString *)0x2411e1);
  QString::~QString((QString *)0x2411ed);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE
static void qt_message(QtMsgType msgType, const QMessageLogContext &context, const char *msg, va_list ap)
{
    QString buf = QString::vasprintf(msg, ap);
    qt_message_print(msgType, context, buf);
    qt_maybe_message_fatal(msgType, context, buf);
}